

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

void __thiscall pbrt::NanoVDBBuffer::clear(NanoVDBBuffer *this)

{
  memory_resource *pmVar1;
  string local_38;
  NanoVDBBuffer *local_18;
  
  if (LOGGING_LogLevel < 1) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_18 = this;
    detail::stringPrintfRecursive<pbrt::NanoVDBBuffer*,unsigned_char*&,unsigned_long&>
              (&local_38,"this %p clear ptr %p bytes %d",&local_18,&this->ptr,&this->bytesAllocated)
    ;
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media.h"
        ,0x21b,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  if (this->ptr != (uint8_t *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->bytesAllocated,0x80);
  }
  this->bytesAllocated = 0;
  this->ptr = (uint8_t *)0x0;
  return;
}

Assistant:

void clear() {
        LOG_VERBOSE("this %p clear ptr %p bytes %d", this, ptr, bytesAllocated);
        alloc.deallocate_bytes(ptr, bytesAllocated, 128);
        bytesAllocated = 0;
        ptr = nullptr;
    }